

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O2

void modifier_reset(png_modifier *pm)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  
  store_read_reset(&pm->this);
  pm->limit = 0.004;
  pm->pending_len = 0;
  pm->pending_chunk = 0;
  pm->modifications = (png_modification *)0x0;
  pm->state = modifier_start;
  pm->flush = 0;
  pm->buffer_count = 0;
  pm->buffer_position = 0;
  bVar3 = pm->field_0x598;
  if ((bVar3 & 3) == 2) {
    if ((pm->field_0x63f & 2) == 0) {
      if (pm->encoding_counter != 0) goto LAB_0010e16e;
      uVar1 = modifier_total_encodings(pm);
      uVar1 = random_mod(uVar1 - 1);
      pm->encoding_counter = uVar1 + 1;
      bVar3 = pm->field_0x598;
    }
    else {
      uVar4 = pm->encoding_counter + 1;
      pm->encoding_counter = uVar4;
      uVar2 = modifier_total_encodings(pm);
      uVar1 = 0;
      if (uVar4 < uVar2) {
        uVar1 = uVar4;
      }
      pm->encoding_counter = uVar1;
      if (uVar1 == 0) goto LAB_0010e1a0;
    }
    bVar3 = bVar3 | 1;
  }
  else {
    if ((bVar3 & 1) != 0) goto LAB_0010e1a0;
LAB_0010e16e:
    pm->encoding_counter = 0;
  }
LAB_0010e1a0:
  pm->field_0x598 = bVar3 & 0xfd;
  pm->current_gamma = 0.0;
  pm->current_encoding = (color_encoding *)0x0;
  pm->encoding_ignored = 0;
  pm->bit_depth = '\0';
  pm->colour_type = '\0';
  return;
}

Assistant:

static void
modifier_reset(png_modifier *pm)
{
   store_read_reset(&pm->this);
   pm->limit = 4E-3;
   pm->pending_len = pm->pending_chunk = 0;
   pm->flush = pm->buffer_count = pm->buffer_position = 0;
   pm->modifications = NULL;
   pm->state = modifier_start;
   modifier_encoding_iterate(pm);
   /* The following must be set in the next run.  In particular
    * test_uses_encodings must be set in the _ini function of each transform
    * that looks at the encodings.  (Not the 'add' function!)
    */
   pm->test_uses_encoding = 0;
   pm->current_gamma = 0;
   pm->current_encoding = 0;
   pm->encoding_ignored = 0;
   /* These only become value after IHDR is read: */
   pm->bit_depth = pm->colour_type = 0;
}